

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

void virtual_proc_start(dill_stream c,char *subr_name,int arg_count,arg_info_list args,
                       dill_reg *arglist)

{
  private_ctx pdVar1;
  undefined8 *puVar2;
  int *piVar3;
  ulong uVar4;
  
  pdVar1 = c->p;
  puVar2 = (undefined8 *)pdVar1->mach_info;
  *puVar2 = args;
  *(undefined4 *)(puVar2 + 3) = 0xffffffff;
  if (0 < arg_count) {
    piVar3 = &pdVar1->c_param_args->in_reg;
    uVar4 = 0;
    do {
      *piVar3 = (int)uVar4;
      uVar4 = uVar4 + 1;
      piVar3 = piVar3 + 5;
    } while ((uint)arg_count != uVar4);
  }
  return;
}

Assistant:

extern void
virtual_proc_start(dill_stream c,
                   char* subr_name,
                   int arg_count,
                   arg_info_list args,
                   dill_reg* arglist)
{
    int i;
    virtual_mach_info vmi = (virtual_mach_info)c->p->mach_info;
    vmi->arg_info = args;
    vmi->prefix_code_start = -1;
    for (i = 0; i < arg_count; i++) {
        c->p->c_param_args[i].in_reg = i;
    }
}